

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BasicVariousTessLevelsPosAttrCase::
BasicVariousTessLevelsPosAttrCase
          (BasicVariousTessLevelsPosAttrCase *this,Context *context,char *name,char *description,
          TessPrimitiveType primitiveType,SpacingMode spacing,char *referenceImagePathPrefix)

{
  allocator<char> local_31;
  SpacingMode local_30;
  TessPrimitiveType local_2c;
  SpacingMode spacing_local;
  TessPrimitiveType primitiveType_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  BasicVariousTessLevelsPosAttrCase *this_local;
  
  local_30 = spacing;
  local_2c = primitiveType;
  _spacing_local = description;
  description_local = name;
  name_local = (char *)context;
  context_local = (Context *)this;
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BasicVariousTessLevelsPosAttrCase_032aea38;
  this->m_primitiveType = local_2c;
  this->m_spacing = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->m_referenceImagePathPrefix,referenceImagePathPrefix,&local_31);
  std::allocator<char>::~allocator(&local_31);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&this->m_program);
  return;
}

Assistant:

BasicVariousTessLevelsPosAttrCase (Context&				context,
													   const char*			name,
													   const char*			description,
													   TessPrimitiveType	primitiveType,
													   SpacingMode			spacing,
													   const char*			referenceImagePathPrefix)
						: TestCase						(context, name, description)
						, m_primitiveType				(primitiveType)
						, m_spacing						(spacing)
						, m_referenceImagePathPrefix	(referenceImagePathPrefix)
					{
					}